

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O1

MPP_RET hal_h265e_vepu511_ret_task(void *hal,HalEncTask *task)

{
  uint uVar1;
  long lVar2;
  EncRcTask *pEVar3;
  EncRcTask *pEVar4;
  long lVar5;
  uint *puVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  
  lVar2 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  pEVar3 = task->rc_task;
  sVar7 = mpp_packet_get_length(task->packet);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0xa84);
  }
  pEVar4 = task->rc_task;
  lVar5 = *(long *)((long)hal + (long)(task->flags).reg_idx * 8 + 0x80);
  iVar11 = *(int *)(*(long *)((long)hal + 0x3b0) + 0xc);
  iVar8 = *(int *)(*(long *)((long)hal + 0x3b0) + 0x10);
  puVar6 = *(uint **)(lVar5 + 0x20);
  uVar1 = *puVar6;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x97a);
  }
  *(int *)(lVar5 + 0x30) = *(int *)(lVar5 + 0x30) + puVar6[4];
  *(int *)(lVar5 + 0x34) = *(int *)(lVar5 + 0x34) + puVar6[1];
  *(long *)(lVar5 + 0x40) = *(long *)(lVar5 + 0x40) + (ulong)(puVar6[3] << 0x10 | puVar6[2] >> 0x10)
  ;
  *(uint *)(lVar5 + 0x28) = uVar1;
  if (((byte)hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","hw_status: 0x%08x",(char *)0x0,(ulong)uVar1);
  }
  if ((uVar1 & 2) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_LINKTABLE_FINISH","vepu511_h265_set_feedback");
  }
  if (((uVar1 & 1) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v511","RKV_ENC_INT_ONE_FRAME_FINISH",(char *)0x0);
  }
  if (((uVar1 & 8) != 0) && (((byte)hal_h265e_debug & 8) != 0)) {
    _mpp_log_l(4,"hal_h265e_v511","RKV_ENC_INT_ONE_SLICE_FINISH",(char *)0x0);
  }
  if ((uVar1 & 4) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_SAFE_CLEAR_FINISH","vepu511_h265_set_feedback");
  }
  if ((uVar1 & 0x10) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_BIT_STREAM_OVERFLOW","vepu511_h265_set_feedback");
  }
  if ((uVar1 & 0x20) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_BUS_WRITE_FULL","vepu511_h265_set_feedback");
  }
  if ((uVar1 & 0x40) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_BUS_WRITE_ERROR","vepu511_h265_set_feedback");
  }
  iVar11 = (iVar8 + 7U & 0x1ffffff8) * (iVar11 + 7U & 0xfffffff8);
  if ((char)uVar1 < '\0') {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_BUS_READ_ERROR","vepu511_h265_set_feedback");
  }
  uVar12 = iVar11 >> 4;
  if ((uVar1 >> 8 & 1) != 0) {
    _mpp_log_l(2,"hal_h265e_v511","RKV_ENC_INT_TIMEOUT_ERROR","vepu511_h265_set_feedback");
  }
  *(int *)(lVar5 + 0x140) = *(int *)(lVar5 + 0x140) + (puVar6[0x29] & 0x7fffff);
  *(int *)(lVar5 + 0x48) = *(int *)(lVar5 + 0x48) + (puVar6[0x21] & 0x1ffff);
  *(int *)(lVar5 + 0x4c) = *(int *)(lVar5 + 0x4c) + (puVar6[0x22] & 0x7ffff);
  iVar10 = (puVar6[0x25] & 0x7ffff) + *(int *)(lVar5 + 0x58);
  *(int *)(lVar5 + 0x58) = iVar10;
  *(int *)(lVar5 + 0x50) = *(int *)(lVar5 + 0x50) + (puVar6[0x23] & 0x1fffff);
  iVar13 = (puVar6[0x26] & 0x1fffff) + *(int *)(lVar5 + 0x5c);
  *(int *)(lVar5 + 0x5c) = iVar13;
  *(int *)(lVar5 + 0x54) = *(int *)(lVar5 + 0x54) + (puVar6[0x24] & 0x7fffff);
  iVar9 = (puVar6[0x27] & 0x7fffff) + *(int *)(lVar5 + 0x60);
  *(int *)(lVar5 + 0x60) = iVar9;
  iVar8 = (puVar6[0x28] & 0x7fffff) + *(int *)(lVar5 + 100);
  *(int *)(lVar5 + 100) = iVar8;
  *(uint *)((long)hal + 0x200) = puVar6[0x52] & 0x7fff;
  *(uint *)((long)hal + 0x204) = puVar6[0x53] & 0x7fff;
  *(uint *)((long)hal + 0x208) = puVar6[0x4e];
  uVar1 = iVar11 >> 6;
  *(uint *)((long)hal + 0x1e4) = puVar6[0x29] & 0x7fffff;
  memcpy((void *)(lVar5 + 0x68),puVar6 + 0x61,0xd0);
  if (0 < (int)uVar12) {
    (pEVar4->info).iblk4_prop =
         (uint)((iVar8 + iVar9) * 0x400 + iVar10 * 0x4000 + iVar13 * 0x1000) / uVar12;
  }
  if (0 < (int)uVar1) {
    (pEVar4->info).quality_real = *(uint *)(lVar5 + 0x30) / uVar1;
  }
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0x9b8);
  }
  mpp_buffer_sync_partial_begin_f
            (task->output,0,(RK_U32)sVar7,*(RK_U32 *)(lVar2 + 0x34),"hal_h265e_vepu511_ret_task");
  hal_h265e_amend_temporal_id(task,*(RK_U32 *)(lVar2 + 0x34));
  (pEVar3->info).sse = *(RK_S64 *)(lVar2 + 0x40);
  (pEVar3->info).lvl64_inter_num = *(RK_U32 *)(lVar2 + 0x48);
  (pEVar3->info).lvl32_inter_num = *(RK_U32 *)(lVar2 + 0x4c);
  (pEVar3->info).lvl16_inter_num = *(RK_U32 *)(lVar2 + 0x50);
  (pEVar3->info).lvl8_inter_num = *(RK_U32 *)(lVar2 + 0x54);
  (pEVar3->info).lvl32_intra_num = *(RK_U32 *)(lVar2 + 0x58);
  (pEVar3->info).lvl16_intra_num = *(RK_U32 *)(lVar2 + 0x5c);
  (pEVar3->info).lvl8_intra_num = *(RK_U32 *)(lVar2 + 0x60);
  (pEVar3->info).lvl4_intra_num = *(RK_U32 *)(lVar2 + 100);
  iVar11 = *(int *)(lVar2 + 0x34);
  task->hw_length = iVar11;
  task->length = task->length + iVar11;
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3c8),*(RK_S32 *)(lVar2 + 0x10));
  h265e_dpb_hal_end(*(H265eDpb **)((long)hal + 0x3c8),*(RK_S32 *)(lVar2 + 0x14));
  if (((byte)hal_h265e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","output stream size %d\n",(char *)0x0,
               (ulong)*(uint *)(lVar2 + 0x34));
  }
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0xa9d);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_vepu511_ret_task(void *hal, HalEncTask *task)
{
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    HalEncTask *enc_task = task;
    RK_S32 task_idx = task->flags.reg_idx;
    Vepu511H265eFrmCfg *frm = ctx->frms[task_idx];
    Vepu511H265Fbk *fb = &frm->feedback;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 offset = mpp_packet_get_length(enc_task->packet);

    hal_h265e_enter();

    vepu511_h265_set_feedback(ctx, enc_task);
    mpp_buffer_sync_partial_begin(enc_task->output, offset, fb->out_strm_size);
    hal_h265e_amend_temporal_id(task, fb->out_strm_size);

    rc_info->sse = fb->sse_sum;
    rc_info->lvl64_inter_num = fb->st_lvl64_inter_num;
    rc_info->lvl32_inter_num = fb->st_lvl32_inter_num;
    rc_info->lvl16_inter_num = fb->st_lvl16_inter_num;
    rc_info->lvl8_inter_num  = fb->st_lvl8_inter_num;
    rc_info->lvl32_intra_num = fb->st_lvl32_intra_num;
    rc_info->lvl16_intra_num = fb->st_lvl16_intra_num;
    rc_info->lvl8_intra_num  = fb->st_lvl8_intra_num;
    rc_info->lvl4_intra_num  = fb->st_lvl4_intra_num;

    enc_task->hw_length = fb->out_strm_size;
    enc_task->length += fb->out_strm_size;

    h265e_dpb_hal_end(ctx->dpb, frm->hal_curr_idx);
    h265e_dpb_hal_end(ctx->dpb, frm->hal_refr_idx);

    // vepu511_h265e_tune_stat_update(ctx->tune, enc_task);

    hal_h265e_dbg_detail("output stream size %d\n", fb->out_strm_size);
    hal_h265e_leave();
    return MPP_OK;
}